

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O1

void __thiscall tvm::runtime::GraphRuntime::LoadParams(GraphRuntime *this,Stream *strm)

{
  undefined8 uVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ostream *poVar3;
  size_t nbytes;
  pointer pbVar4;
  ulong uVar5;
  size_type sVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  uint32_t eid;
  LogCheckError _check_err;
  uint64_t sz;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  uint64_t header;
  uint64_t reserved;
  uint64_t sz_2;
  uint local_204;
  LogCheckError local_200;
  Stream *local_1f8;
  size_type local_1f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e8;
  GraphRuntime *local_1d0;
  long local_1c8;
  undefined1 local_1c0 [8];
  LogMessageFatal local_1b8;
  
  local_1f8 = strm;
  iVar2 = (**strm->_vptr_Stream)(strm,&local_1c8,8);
  if (CONCAT44(extraout_var,iVar2) != 8) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xa4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"Check failed: strm->Read(&header)",0x21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"Invalid parameters file format",0x1e);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
  }
  if (local_1c8 != -0x81a72b0fafb6349) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xa6);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"Check failed: header == kTVMNDArrayListMagic",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"Invalid parameters file format",0x1e);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
  }
  iVar2 = (**local_1f8->_vptr_Stream)(local_1f8,local_1c0,8);
  if (CONCAT44(extraout_var_00,iVar2) != 8) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xa8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"Check failed: strm->Read(&reserved)",0x23);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"Invalid parameters file format",0x1e);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
  }
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = (**local_1f8->_vptr_Stream)(local_1f8,&local_1f0,8);
  sVar6 = local_1f0;
  if (CONCAT44(extraout_var_01,iVar2) == 8) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&local_1e8,local_1f0);
    pbVar4 = (pointer)0x0;
    if (local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_1e8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pbVar4 = local_1e8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    bVar8 = sVar6 == 0;
    local_1d0 = this;
    if (!bVar8) {
      uVar5 = 1;
      do {
        iVar2 = (**local_1f8->_vptr_Stream)(local_1f8,&local_1b8,8);
        uVar1 = local_1b8._0_8_;
        if (CONCAT44(extraout_var_02,iVar2) != 8) break;
        std::__cxx11::string::resize((ulong)pbVar4,local_1b8.log_stream_);
        if (local_1b8._0_8_ != 0) {
          iVar2 = (**local_1f8->_vptr_Stream)(local_1f8,(pbVar4->_M_dataplus)._M_p,uVar1);
          if (CONCAT44(extraout_var_03,iVar2) != uVar1) break;
        }
        bVar8 = sVar6 <= uVar5;
        pbVar4 = pbVar4 + 1;
        bVar9 = uVar5 != sVar6;
        uVar5 = uVar5 + 1;
      } while (bVar9);
    }
    this = local_1d0;
    if (bVar8) goto LAB_0011098a;
  }
  dmlc::LogMessageFatal::LogMessageFatal
            (&local_1b8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
             ,0xac);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b8,"Check failed: strm->Read(&names)",0x20);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,": ",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1b8,"Invalid parameters file format",0x1e);
  dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
LAB_0011098a:
  (**local_1f8->_vptr_Stream)(local_1f8,&local_1f0,8);
  if (local_1f0 !=
      (long)local_1e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_1e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    dmlc::LogMessageFatal::LogMessageFatal
              (&local_1b8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
               ,0xb1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"Check failed: size == names.size()",0x22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,": ",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8,"Invalid parameters file format",0x1e);
    dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
  }
  if (local_1f0 != 0) {
    lVar7 = 0;
    sVar6 = local_1f0;
    do {
      iVar2 = GetInputIndex(this,(string *)
                                 ((long)&((local_1e8.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar7));
      local_1b8._0_4_ = iVar2;
      local_204 = 0;
      dmlc::LogCheck_GE<int,int>((dmlc *)&local_200,(int *)&local_1b8,(int *)&local_204);
      if (local_200.str != (string *)0x0) {
        dmlc::LogMessageFatal::LogMessageFatal
                  (&local_1b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                   ,0xb5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"Check failed: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8,"in_idx >= 0",0xb);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b8,((local_200.str)->_M_dataplus)._M_p,
                            (local_200.str)->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,"Found param for non-existent input: ",0x24);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar3,*(char **)((long)&((local_1e8.
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar7),
                   *(long *)((long)&(local_1e8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            lVar7));
        dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
      }
      dmlc::LogCheckError::~LogCheckError(&local_200);
      local_204 = (this->node_row_ptr_).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start
                  [(this->input_nodes_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2]];
      local_1b8._0_8_ =
           (long)(this->data_entry_).
                 super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->data_entry_).
                 super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 3;
      dmlc::LogCheck_LT<unsigned_int,unsigned_long>
                ((dmlc *)&local_200,&local_204,(unsigned_long *)&local_1b8);
      if (local_200.str != (string *)0x0) {
        dmlc::LogMessageFatal::LogMessageFatal
                  (&local_1b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/graph/graph_runtime.cc"
                   ,0xb7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"Check failed: ",0xe);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1b8,"eid < data_entry_.size()",0x18);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_1b8,((local_200.str)->_M_dataplus)._M_p,
                            (local_200.str)->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,": ",2);
        dmlc::LogMessageFatal::~LogMessageFatal(&local_1b8);
      }
      dmlc::LogCheckError::~LogCheckError(&local_200);
      local_1b8._0_8_ = 0;
      NDArray::Load((NDArray *)&local_1b8,local_1f8);
      NDArray::CopyFrom((this->data_entry_).
                        super__Vector_base<tvm::runtime::NDArray,_std::allocator<tvm::runtime::NDArray>_>
                        ._M_impl.super__Vector_impl_data._M_start + local_204,(NDArray *)&local_1b8)
      ;
      NDArray::~NDArray((NDArray *)&local_1b8);
      lVar7 = lVar7 + 0x20;
      sVar6 = sVar6 - 1;
    } while (sVar6 != 0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1e8);
  return;
}

Assistant:

void GraphRuntime::LoadParams(dmlc::Stream *strm) {
  uint64_t header, reserved;
  CHECK(strm->Read(&header))
      << "Invalid parameters file format";
  CHECK(header == kTVMNDArrayListMagic)
      << "Invalid parameters file format";
  CHECK(strm->Read(&reserved))
      << "Invalid parameters file format";

  std::vector<std::string> names;
  CHECK(strm->Read(&names))
      << "Invalid parameters file format";
  uint64_t sz;
  strm->Read(&sz);
  size_t size = static_cast<size_t>(sz);
  CHECK(size == names.size())
      << "Invalid parameters file format";
  for (size_t i = 0; i < size; ++i) {
    int in_idx = GetInputIndex(names[i]);
    CHECK_GE(in_idx, 0) << "Found param for non-existent input: " << names[i];
    uint32_t eid = this->entry_id(input_nodes_[in_idx], 0);
    CHECK_LT(eid, data_entry_.size());

    // The data_entry is allocated on device, NDArray.load always load the array into CPU.
    NDArray temp;
    temp.Load(strm);

    /* [RISCV-DLR] Write all data_entry */
#ifdef weight_dump
    size_t shape_size = 1;
    for (int64_t sz : attrs_.shape[in_idx]) {
      shape_size *= static_cast<size_t>(sz);
    }
    std::ofstream out_("./module/" + names[i], std::ios::out | std::ios::binary);
    if (!out_)
      assert(0);
    DLDataType t = tvm::runtime::String2TVMType(attrs_.dltype[in_idx]);
    size_t bits = t.bits * t.lanes;
    CHECK(bits % 8U == 0U || bits == 1U);
    size_t bytes = ((bits + 7U) / 8U) * shape_size;
    out_.write((char *)((*temp.operator->()).data), bytes);
    out_.close();
#endif
    data_entry_[eid].CopyFrom(temp);
  }
}